

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.h
# Opt level: O2

void __thiscall mdsplit::mdsplitter::mdsplitter(mdsplitter *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_8a;
  allocator<char> local_89;
  undefined1 local_88 [64];
  path local_48;
  
  std::filesystem::__cxx11::path::path<char[10],std::filesystem::__cxx11::path>
            (&this->input_,(char (*) [10])"README.md",auto_format);
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_48,(char (*) [5])"docs",auto_format);
  std::filesystem::__cxx11::operator/(&this->output_dir_,(path *)local_88,&local_48);
  std::filesystem::__cxx11::path::~path(&local_48);
  std::filesystem::__cxx11::path::~path((path *)local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"details",(allocator<char> *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_88 + 0x20),"summary",&local_89);
  __l._M_len = 2;
  __l._M_array = (iterator)local_88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->clear_html_tags_,__l,&local_8a);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_88 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  (this->repository_)._M_dataplus._M_p = (pointer)&(this->repository_).field_2;
  (this->repository_)._M_string_length = 0;
  (this->repository_).field_2._M_local_buf[0] = '\0';
  this->max_split_level_ = 4;
  this->include_toc_ = true;
  this->jekyll_escape_ = true;
  this->indent_headers_ = true;
  this->add_front_matter_ = true;
  this->update_links_ = true;
  this->remove_autotoc_ = true;
  this->trace_ = true;
  this->erase_old_mdsplit_files_ = true;
  std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
            ((path *)local_88,(char (*) [9])"index.md",auto_format);
  std::filesystem::__cxx11::operator/
            (&this->current_output_file_,&this->output_dir_,(path *)local_88);
  std::filesystem::__cxx11::path::~path((path *)local_88);
  (this->sections_).super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sections_).super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sections_).super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

mdsplitter() = default;